

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.cpp
# Opt level: O1

int countint(TValue *key,int *nums)

{
  double dVar1;
  int iVar2;
  uint x;
  
  if (key->tt == 3) {
    dVar1 = (key->value).n;
    if ((dVar1 == (double)(int)dVar1) && (!NAN(dVar1) && !NAN((double)(int)dVar1))) {
      iVar2 = (int)dVar1;
      goto LAB_00114d91;
    }
  }
  iVar2 = -1;
LAB_00114d91:
  x = iVar2 - 1;
  if (x < 0x4000000) {
    iVar2 = luaO_log2(x);
    nums[(long)iVar2 + 1] = nums[(long)iVar2 + 1] + 1;
  }
  return (uint)(x < 0x4000000);
}

Assistant:

static int countint (const TValue *key, int *nums) {
  int k = arrayindex(key);
  if (0 < k && k <= MAXASIZE) {  /* is `key' an appropriate array index? */
    nums[ceillog2(k)]++;  /* count as such */
    return 1;
  }
  else
    return 0;
}